

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WLANOptimizer.cpp
# Opt level: O2

void __thiscall WLANOptimizerThread::Stop(WLANOptimizerThread *this)

{
  unique_lock<std::mutex> wakeLocker;
  undefined1 local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  std::mutex::lock(&this->StartStopLock);
  if ((this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    LOCK();
    (this->Terminated)._M_base._M_i = true;
    UNLOCK();
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->WakeLock);
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
    if ((((this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_id)
        ._M_thread != 0) {
      std::thread::join();
    }
    local_28 = (undefined1  [8])0x0;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->Thread).super___shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2> *)local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_20);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void WLANOptimizerThread::Stop()
{
    std::lock_guard<std::mutex> startStopLocker(StartStopLock);

    if (Thread)
    {
        Terminated = true;

        // Make sure that queue notification happens after termination flag is set
        {
            std::unique_lock<std::mutex> wakeLocker(WakeLock);
            WakeCondition.notify_all();
        }

        // Wait for thread to stop
        try
        {
            if (Thread->joinable()) {
                Thread->join();
            }
        }
        catch (std::system_error& /*err*/)
        {
        }

        Thread = nullptr;
    }
}